

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kd_tree_builder.hpp
# Opt level: O3

node_type * __thiscall
pico_tree::internal::
build_kd_tree_impl<pico_tree::internal::space_wrapper<pico_tree::internal::matrix_space<float,784ul>>,pico_tree::max_leaf_size_t,pico_tree::sliding_midpoint_max_side_t,pico_tree::internal::kd_tree_data<pico_tree::internal::kd_tree_node_topological<int,float>,784ul>>
::create_node<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
          (build_kd_tree_impl<pico_tree::internal::space_wrapper<pico_tree::internal::matrix_space<float,784ul>>,pico_tree::max_leaf_size_t,pico_tree::sliding_midpoint_max_side_t,pico_tree::internal::kd_tree_data<pico_tree::internal::kd_tree_node_topological<int,float>,784ul>>
           *this,index_type depth,
          __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> begin,
          __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> end,box_type *box)

{
  build_kd_tree_impl<pico_tree::internal::space_wrapper<pico_tree::internal::matrix_space<float,784ul>>,pico_tree::max_leaf_size_t,pico_tree::sliding_midpoint_max_side_t,pico_tree::internal::kd_tree_data<pico_tree::internal::kd_tree_node_topological<int,float>,784ul>>
  *pbVar1;
  float *pfVar2;
  node_type *pnVar3;
  size_type sVar4;
  float fVar5;
  size_type i;
  undefined8 *puVar6;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> __nth;
  node_type *pnVar7;
  long lVar8;
  size_type sVar9;
  long lVar10;
  long lVar11;
  int depth_00;
  ulong uVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  _Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_Jaybro[P]pico_tree_src_pico_tree_pico_tree_internal_kd_tree_builder_hpp:261:11)>
  __comp;
  _Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_Jaybro[P]pico_tree_src_pico_tree_pico_tree_internal_kd_tree_builder_hpp:271:11)>
  __comp_00;
  size_type split_dim;
  scalar_type split_val;
  box_type right;
  size_type local_18d8;
  float local_18cc;
  float local_18c8;
  index_type local_18c4;
  node_type *local_18c0;
  build_kd_tree_impl<pico_tree::internal::space_wrapper<pico_tree::internal::matrix_space<float,784ul>>,pico_tree::max_leaf_size_t,pico_tree::sliding_midpoint_max_side_t,pico_tree::internal::kd_tree_data<pico_tree::internal::kd_tree_node_topological<int,float>,784ul>>
  *local_18b8;
  undefined1 local_18b0 [16];
  float *local_18a0;
  float afStack_c70 [784];
  
  lVar8 = *(long *)(this + 0x20);
  lVar10 = *(long *)(lVar8 + 0x10);
  local_18c4 = depth;
  if (lVar10 == 0x100) {
    puVar6 = (undefined8 *)operator_new(0x2808);
    *puVar6 = *(undefined8 *)(lVar8 + 8);
    *(undefined8 **)(lVar8 + 8) = puVar6;
    puVar6 = puVar6 + 1;
    *(undefined8 **)(lVar8 + 0x18) = puVar6;
    lVar10 = 0;
  }
  else {
    puVar6 = *(undefined8 **)(lVar8 + 0x18);
  }
  local_18c0 = (node_type *)(puVar6 + lVar10 * 5);
  *(long *)(lVar8 + 0x10) = lVar10 + 1;
  uVar12 = (long)end._M_current - (long)begin._M_current >> 2;
  local_18d8 = (size_type)*(int *)(this + 8);
  if ((long)uVar12 <= (long)local_18d8) {
    lVar8 = **(long **)(this + 0x18);
    (local_18c0->data).branch.split_dim = (int)((ulong)((long)begin._M_current - lVar8) >> 2);
    (local_18c0->data).leaf.end_idx = (int)((ulong)((long)end._M_current - lVar8) >> 2);
    (local_18c0->super_kd_tree_node_base<pico_tree::internal::kd_tree_node_topological<int,_float>_>
    ).left = (kd_tree_node_topological<int,_float> *)0x0;
    (local_18c0->super_kd_tree_node_base<pico_tree::internal::kd_tree_node_topological<int,_float>_>
    ).right = (kd_tree_node_topological<int,_float> *)0x0;
    lVar8 = -0x310;
    do {
      pfVar2 = (box->storage_).coords_max._M_elems + lVar8;
      pfVar2[0] = 3.4028235e+38;
      pfVar2[1] = 3.4028235e+38;
      pfVar2[2] = 3.4028235e+38;
      pfVar2[3] = 3.4028235e+38;
      pfVar2 = box[1].storage_.coords_min._M_elems + lVar8;
      pfVar2[0] = -3.4028235e+38;
      pfVar2[1] = -3.4028235e+38;
      pfVar2[2] = -3.4028235e+38;
      pfVar2[3] = -3.4028235e+38;
      lVar8 = lVar8 + 4;
    } while (lVar8 != 0);
    if (end._M_current <= begin._M_current) {
      return local_18c0;
    }
    lVar8 = *(long *)(**(long **)this + 8);
    do {
      lVar10 = (long)*begin._M_current * 0xc40 + lVar8;
      lVar11 = 0;
      do {
        fVar13 = *(float *)(lVar10 + lVar11 * 4);
        if (fVar13 < (box->storage_).coords_min._M_elems[lVar11]) {
          (box->storage_).coords_min._M_elems[lVar11] = fVar13;
          fVar13 = *(float *)(lVar10 + lVar11 * 4);
        }
        pfVar2 = (box->storage_).coords_max._M_elems + lVar11;
        if (*pfVar2 <= fVar13 && fVar13 != *pfVar2) {
          (box->storage_).coords_max._M_elems[lVar11] = fVar13;
        }
        lVar11 = lVar11 + 1;
      } while (lVar11 != 0x310);
      begin._M_current = begin._M_current + 1;
    } while (begin._M_current < end._M_current);
    return local_18c0;
  }
  fVar13 = -3.4028235e+38;
  sVar9 = 0;
  fVar14 = -3.4028235e+38;
  do {
    fVar15 = (box->storage_).coords_max._M_elems[sVar9] - (box->storage_).coords_min._M_elems[sVar9]
    ;
    sVar4 = sVar9;
    fVar5 = fVar15;
    if (fVar15 <= fVar14) {
      fVar15 = fVar14;
      sVar4 = local_18d8;
      fVar5 = fVar13;
    }
    fVar13 = fVar5;
    local_18d8 = sVar4;
    fVar14 = fVar15;
    sVar9 = sVar9 + 1;
  } while (sVar9 != 0x310);
  pbVar1 = this + 0x10;
  local_18b0._8_8_ = &local_18d8;
  local_18c8 = fVar13 * 0.5 + (box->storage_).coords_min._M_elems[local_18d8];
  local_18a0 = &local_18c8;
  local_18b8 = this;
  local_18b0._0_8_ = pbVar1;
  __nth = ::std::operator()(begin._M_current,end._M_current);
  if (__nth._M_current == end._M_current) {
    __nth._M_current = __nth._M_current + -1;
    if (begin._M_current != end._M_current) {
      lVar8 = 0x3f;
      if (uVar12 != 0) {
        for (; uVar12 >> lVar8 == 0; lVar8 = lVar8 + -1) {
        }
      }
      __comp._M_comp.split_dim = &local_18d8;
      __comp._M_comp.this =
           (splitter_sliding_midpoint_max_side<pico_tree::internal::space_wrapper<std::vector<std::array<float,_784UL>,_std::allocator<std::array<float,_784UL>_>_>_>_>
            *)pbVar1;
      ::std::operator()(begin,__nth,end,(ulong)(((uint)lVar8 ^ 0x3f) * 2) ^ 0x7e,__comp);
    }
  }
  else {
    if (__nth._M_current != begin._M_current) goto LAB_0010694a;
    __nth._M_current = __nth._M_current + 1;
    if (__nth._M_current != end._M_current && begin._M_current != end._M_current) {
      lVar8 = 0x3f;
      if (uVar12 != 0) {
        for (; uVar12 >> lVar8 == 0; lVar8 = lVar8 + -1) {
        }
      }
      __comp_00._M_comp.split_dim = &local_18d8;
      __comp_00._M_comp.this =
           (splitter_sliding_midpoint_max_side<pico_tree::internal::space_wrapper<std::vector<std::array<float,_784UL>,_std::allocator<std::array<float,_784UL>_>_>_>_>
            *)pbVar1;
      ::std::operator()(begin,__nth,end,(ulong)(((uint)lVar8 ^ 0x3f) * 2) ^ 0x7e,__comp_00);
    }
  }
  local_18c8 = *(float *)((long)*__nth._M_current * 0xc40 + *(long *)(*(long *)pbVar1 + 8) +
                         local_18d8 * 4);
LAB_0010694a:
  sVar9 = local_18d8;
  local_18cc = local_18c8;
  memcpy(local_18b0,box,0x1880);
  pbVar1 = local_18b8;
  (box->storage_).coords_max._M_elems[sVar9] = local_18cc;
  *(float *)(local_18b0 + sVar9 * 4) = local_18cc;
  depth_00 = local_18c4 + 1;
  pnVar7 = create_node<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
                     (local_18b8,depth_00,begin,__nth,box);
  pnVar3 = local_18c0;
  (local_18c0->super_kd_tree_node_base<pico_tree::internal::kd_tree_node_topological<int,_float>_>).
  left = pnVar7;
  pnVar7 = create_node<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
                     (pbVar1,depth_00,__nth,end,(box_type *)local_18b0);
  (pnVar3->super_kd_tree_node_base<pico_tree::internal::kd_tree_node_topological<int,_float>_>).
  right = pnVar7;
  (pnVar3->data).branch.split_dim = (int)local_18d8;
  (pnVar3->data).branch.left_min = (box->storage_).coords_min._M_elems[local_18d8];
  (pnVar3->data).branch.left_max = (box->storage_).coords_max._M_elems[local_18d8];
  (pnVar3->data).branch.right_min = *(float *)(local_18b0 + local_18d8 * 4);
  (pnVar3->data).branch.right_max = afStack_c70[local_18d8];
  lVar8 = 0;
  do {
    if (*(float *)(local_18b0 + lVar8 * 4) < (box->storage_).coords_min._M_elems[lVar8]) {
      (box->storage_).coords_min._M_elems[lVar8] = *(float *)(local_18b0 + lVar8 * 4);
    }
    fVar13 = afStack_c70[lVar8];
    pfVar2 = (box->storage_).coords_max._M_elems + lVar8;
    if (*pfVar2 <= fVar13 && fVar13 != *pfVar2) {
      (box->storage_).coords_max._M_elems[lVar8] = fVar13;
    }
    lVar8 = lVar8 + 1;
  } while (lVar8 != 0x310);
  return pnVar3;
}

Assistant:

inline node_type* create_node(
      index_type const depth,
      RandomAccessIterator_ begin,
      RandomAccessIterator_ end,
      box_type& box) const {
    node_type* node = allocator_.allocate();

    if (is_leaf(depth, begin, end)) {
      node->set_leaf(
          static_cast<index_type>(begin - indices_.begin()),
          static_cast<index_type>(end - indices_.begin()));
      // Keep the original box in case it is empty. This can only happen with
      // the midpoint split.
      if constexpr (std::is_same_v<Rule_, midpoint_max_side_t>) {
        if (begin < end) {
          compute_bounding_box(begin, end, box);
        }
      } else {
        compute_bounding_box(begin, end, box);
      }
    } else {
      // split equals end for the left branch and begin for the right branch.
      RandomAccessIterator_ split;
      size_type split_dim;
      scalar_type split_val;
      splitter_(depth, begin, end, box, split, split_dim, split_val);

      box_type right = box;
      // Argument box will function as the left bounding box until we merge
      // left and right again at the end of this code section.
      box.max(split_dim) = split_val;
      right.min(split_dim) = split_val;

      node->left = create_node(depth + 1, begin, split, box);
      node->right = create_node(depth + 1, split, end, right);

      node->set_branch(box, right, split_dim);

      // Merges both child boxes. We can expect any of the min max values to
      // change except for the ones of split_dim.
      box.fit(right);
    }

    return node;
  }